

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.h
# Opt level: O3

value_type * __thiscall
YAML::detail::iterator_base<YAML::detail::iterator_value>::operator*
          (value_type *__return_storage_ptr__,iterator_base<YAML::detail::iterator_value> *this)

{
  value vVar1;
  pair<YAML::detail::node_*,_YAML::detail::node_*> *ppVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  Node local_a8;
  Node local_68;
  
  vVar1 = (this->m_iterator).m_type;
  if (vVar1 == Map) {
    ppVar2 = (this->m_iterator).m_mapIt._M_current;
    local_a8.m_pNode = ppVar2->first;
    local_68.m_pNode = ppVar2->second;
    if (local_68.m_pNode == (node *)0x0 || local_a8.m_pNode == (node *)0x0) goto LAB_00422be2;
    local_a8.m_pMemory.super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (this->m_pMemory).
             super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this_01 = (this->m_pMemory).
              super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_a8.m_pMemory.super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      local_a8.m_pMemory.super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = this_01;
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_01->_M_use_count = this_01->_M_use_count + 1;
        UNLOCK();
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_01->_M_use_count = this_01->_M_use_count + 1;
          UNLOCK();
          goto LAB_00422da1;
        }
      }
      else {
        this_01->_M_use_count = this_01->_M_use_count + 1;
      }
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
LAB_00422da1:
    local_a8.m_invalidKey.field_2._M_local_buf[0] = '\0';
    local_a8.m_invalidKey._M_string_length = 0;
    local_a8.m_isValid = true;
    paVar4 = &local_a8.m_invalidKey.field_2;
    local_68.m_pMemory.super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (this->m_pMemory).
             super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this_00 = (this->m_pMemory).
              super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_68.m_pMemory.super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      local_68.m_pMemory.super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = this_00;
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
          goto LAB_00422e3f;
        }
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
LAB_00422e3f:
    local_68.m_invalidKey.field_2._M_local_buf[0] = '\0';
    local_68.m_invalidKey._M_string_length = 0;
    local_68.m_isValid = true;
    paVar3 = &local_68.m_invalidKey.field_2;
    local_a8.m_invalidKey._M_dataplus._M_p = (pointer)paVar4;
    local_68.m_invalidKey._M_dataplus._M_p = (pointer)paVar3;
    iterator_value::iterator_value(__return_storage_ptr__,&local_a8,&local_68);
    if (local_68.m_pMemory.
        super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.m_pMemory.
                 super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.m_invalidKey._M_dataplus._M_p != paVar3) {
      operator_delete(local_68.m_invalidKey._M_dataplus._M_p);
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if (local_a8.m_pMemory.
        super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a8.m_pMemory.
                 super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8.m_invalidKey._M_dataplus._M_p == paVar4) goto LAB_00422d4d;
  }
  else {
    if ((vVar1 != Sequence) ||
       (local_a8.m_pNode = *(this->m_iterator).m_seqIt._M_current, local_a8.m_pNode == (node *)0x0))
    {
LAB_00422be2:
      memset(__return_storage_ptr__,0,0xa8);
      (__return_storage_ptr__->super_Node).m_isValid = true;
      (__return_storage_ptr__->super_Node).m_invalidKey._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->super_Node).m_invalidKey.field_2;
      (__return_storage_ptr__->super_Node).m_invalidKey.field_2._M_local_buf[0] = '\0';
      (__return_storage_ptr__->super_Node).m_pMemory.
      super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (__return_storage_ptr__->super_Node).m_pMemory.
      super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (__return_storage_ptr__->super_Node).m_pNode = (node *)0x0;
      (__return_storage_ptr__->super_pair<YAML::Node,_YAML::Node>).first.m_isValid = true;
      (__return_storage_ptr__->super_pair<YAML::Node,_YAML::Node>).first.m_invalidKey._M_dataplus.
      _M_p = (pointer)&(__return_storage_ptr__->super_pair<YAML::Node,_YAML::Node>).first.
                       m_invalidKey.field_2;
      (__return_storage_ptr__->super_pair<YAML::Node,_YAML::Node>).first.m_invalidKey.field_2.
      _M_local_buf[0] = '\0';
      (__return_storage_ptr__->super_pair<YAML::Node,_YAML::Node>).first.m_pMemory.
      super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (__return_storage_ptr__->super_pair<YAML::Node,_YAML::Node>).first.m_pMemory.
      super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (__return_storage_ptr__->super_pair<YAML::Node,_YAML::Node>).first.m_pNode = (node *)0x0;
      (__return_storage_ptr__->super_pair<YAML::Node,_YAML::Node>).second.m_isValid = true;
      (__return_storage_ptr__->super_pair<YAML::Node,_YAML::Node>).second.m_invalidKey._M_dataplus.
      _M_p = (pointer)&(__return_storage_ptr__->super_pair<YAML::Node,_YAML::Node>).second.
                       m_invalidKey.field_2;
      (__return_storage_ptr__->super_pair<YAML::Node,_YAML::Node>).second.m_invalidKey.field_2.
      _M_local_buf[0] = '\0';
      (__return_storage_ptr__->super_pair<YAML::Node,_YAML::Node>).second.m_pMemory.
      super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (__return_storage_ptr__->super_pair<YAML::Node,_YAML::Node>).second.m_pMemory.
      super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (__return_storage_ptr__->super_pair<YAML::Node,_YAML::Node>).second.m_pNode = (node *)0x0;
      return __return_storage_ptr__;
    }
    local_a8.m_pMemory.super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (this->m_pMemory).
             super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this_01 = (this->m_pMemory).
              super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_a8.m_pMemory.super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      local_a8.m_pMemory.super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = this_01;
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_01->_M_use_count = this_01->_M_use_count + 1;
        UNLOCK();
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_01->_M_use_count = this_01->_M_use_count + 1;
          UNLOCK();
          goto LAB_00422d20;
        }
      }
      else {
        this_01->_M_use_count = this_01->_M_use_count + 1;
      }
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
LAB_00422d20:
    local_a8.m_invalidKey.field_2._M_local_buf[0] = '\0';
    local_a8.m_invalidKey._M_string_length = 0;
    local_a8.m_isValid = true;
    paVar4 = &local_a8.m_invalidKey.field_2;
    local_a8.m_invalidKey._M_dataplus._M_p = (pointer)paVar4;
    iterator_value::iterator_value(__return_storage_ptr__,&local_a8);
    if (local_a8.m_pMemory.
        super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a8.m_pMemory.
                 super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8.m_invalidKey._M_dataplus._M_p == paVar4) goto LAB_00422d4d;
  }
  operator_delete(local_a8.m_invalidKey._M_dataplus._M_p);
LAB_00422d4d:
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  return __return_storage_ptr__;
}

Assistant:

value_type operator*() const {
    const typename base_type::value_type& v = *m_iterator;
    if (v.pNode)
      return value_type(Node(*v, m_pMemory));
    if (v.first && v.second)
      return value_type(Node(*v.first, m_pMemory), Node(*v.second, m_pMemory));
    return value_type();
  }